

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  undefined8 in_RDX;
  char *pcVar5;
  bool local_2e5;
  char *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [32];
  char *local_1e8;
  spirv_cross local_1e0 [32];
  char *local_1c0;
  spirv_cross local_1b8 [38];
  undefined1 local_192;
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  allocator local_169;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  SPIREntryPoint *local_120;
  SPIREntryPoint *execution;
  string entry_type;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [39];
  byte local_91;
  undefined4 local_90;
  bool ep_should_return_output;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string return_type;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  (*(type->super_IVariant)._vptr_IVariant[0x13])(local_60,type,in_RDX,0);
  (*(type->super_IVariant)._vptr_IVariant[0x23])(local_80,type,in_RDX);
  ::std::operator+(local_40,local_60);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string((string *)local_60);
  if ((type[0x17].image.type.id & 1) == 0) {
    ::std::__cxx11::string::string((string *)this,(string *)local_40);
    local_90 = 1;
  }
  else {
    bVar1 = get_is_rasterization_disabled((CompilerMSL *)type);
    local_91 = ~bVar1 & 1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type[0x1d].image.format);
    if ((uVar2 != 0) && ((local_91 & 1) != 0)) {
      pSVar3 = get_stage_out_struct_type((CompilerMSL *)type);
      (*(type->super_IVariant)._vptr_IVariant[0x13])(local_d8,type,pSVar3,0);
      (*(type->super_IVariant)._vptr_IVariant[0x23])(local_f8,type,in_RDX);
      ::std::operator+(local_b8,local_d8);
      ::std::__cxx11::string::operator=((string *)local_40,(string *)local_b8);
      ::std::__cxx11::string::~string((string *)local_b8);
      ::std::__cxx11::string::~string(local_f8);
      ::std::__cxx11::string::~string((string *)local_d8);
    }
    ::std::__cxx11::string::string((string *)&execution);
    local_120 = Compiler::get_entry_point((Compiler *)type);
    switch(local_120->model) {
    case ExecutionModelVertex:
      if (((type[0x1c].array.stack_storage.aligned_char[0x11] & 1U) != 0) &&
         (bVar1 = Options::supports_msl_version
                            ((Options *)
                             &type[0x1b].member_name_cache._M_h._M_rehash_policy.field_0x4,1,2,0),
         !bVar1)) {
        local_142 = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_140,"Tessellation requires Metal 1.2.",&local_141);
        CompilerError::CompilerError(pCVar4,(string *)local_140);
        local_142 = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((type[0x1c].array.stack_storage.aligned_char[0x11] & 1U) == 0) {
        local_2b0 = "vertex";
      }
      else {
        local_2b0 = "kernel";
      }
      ::std::__cxx11::string::operator=((string *)&execution,local_2b0);
      break;
    case ExecutionModelTessellationControl:
      bVar1 = Options::supports_msl_version
                        ((Options *)&type[0x1b].member_name_cache._M_h._M_rehash_policy.field_0x4,1,
                         2,0);
      if (!bVar1) {
        local_20a = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_208,"Tessellation requires Metal 1.2.",&local_209);
        CompilerError::CompilerError(pCVar4,(string *)local_208);
        local_20a = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar1 = Bitset::get(&local_120->flags,0x19);
      if (bVar1) {
        local_232 = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_230,"Metal does not support isoline tessellation.",&local_231);
        CompilerError::CompilerError(pCVar4,(string *)local_230);
        local_232 = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    case ExecutionModelGLCompute:
    case ExecutionModelKernel:
      ::std::__cxx11::string::operator=((string *)&execution,"kernel");
      break;
    case ExecutionModelTessellationEvaluation:
      bVar1 = Options::supports_msl_version
                        ((Options *)&type[0x1b].member_name_cache._M_h._M_rehash_policy.field_0x4,1,
                         2,0);
      if (!bVar1) {
        local_16a = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_168,"Tessellation requires Metal 1.2.",&local_169);
        CompilerError::CompilerError(pCVar4,(string *)local_168);
        local_16a = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar1 = Bitset::get(&local_120->flags,0x19);
      if (bVar1) {
        local_192 = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_190,"Metal does not support isoline tessellation.",&local_191);
        CompilerError::CompilerError(pCVar4,(string *)local_190);
        local_192 = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar1 = Options::is_ios((Options *)
                              &type[0x1b].member_name_cache._M_h._M_rehash_policy.field_0x4);
      if (bVar1) {
        bVar1 = Bitset::get(&local_120->flags,0x16);
        local_1c0 = "quad";
        if (bVar1) {
          local_1c0 = "triangle";
        }
        join<char_const(&)[10],char_const*,char_const(&)[12]>
                  (local_1b8,(char (*) [10])"[[ patch(",&local_1c0,(char (*) [12])") ]] vertex");
        ::std::__cxx11::string::operator=((string *)&execution,(string *)local_1b8);
        ::std::__cxx11::string::~string((string *)local_1b8);
      }
      else {
        bVar1 = Bitset::get(&local_120->flags,0x16);
        local_1e8 = "quad";
        if (bVar1) {
          local_1e8 = "triangle";
        }
        join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                  (local_1e0,(char (*) [10])"[[ patch(",&local_1e8,(char (*) [3])0x4f06f8,
                   &local_120->output_vertices,(char (*) [12])") ]] vertex");
        ::std::__cxx11::string::operator=((string *)&execution,(string *)local_1e0);
        ::std::__cxx11::string::~string((string *)local_1e0);
      }
      break;
    default:
      ::std::__cxx11::string::operator=((string *)&execution,"unknown");
      break;
    case ExecutionModelFragment:
      bVar1 = Bitset::get(&local_120->flags,9);
      local_2e5 = true;
      if (!bVar1) {
        local_2e5 = Bitset::get(&local_120->flags,0x115e);
      }
      pcVar5 = "fragment";
      if (local_2e5 != false) {
        pcVar5 = "[[ early_fragment_tests ]] fragment";
      }
      ::std::__cxx11::string::operator=((string *)&execution,pcVar5);
    }
    ::std::operator+(local_258,(char *)&execution);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_258);
    ::std::__cxx11::string::~string((string *)local_258);
    local_90 = 1;
    ::std::__cxx11::string::~string((string *)&execution);
  }
  ::std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type =
			    join("[[ patch(", execution.flags.get(ExecutionModeTriangles) ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", execution.flags.get(ExecutionModeTriangles) ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = execution.flags.get(ExecutionModeEarlyFragmentTests) ||
		                     execution.flags.get(ExecutionModePostDepthCoverage) ?
		                 "[[ early_fragment_tests ]] fragment" :
		                 "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}